

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

FSerializer *
Serialize<TObjPtr<AActor>,TObjPtr<AActor>>
          (FSerializer *arc,char *key,TArray<TObjPtr<AActor>,_TObjPtr<AActor>_> *value,
          TArray<TObjPtr<AActor>,_TObjPtr<AActor>_> *param_4)

{
  bool bVar1;
  uint amount;
  uint i;
  ulong uVar2;
  long lVar3;
  
  if ((arc->w == (FWriter *)0x0) || (value->Count != 0)) {
    bVar1 = FSerializer::BeginArray(arc,key);
    if (arc->r != (FReader *)0x0) {
      if (!bVar1) {
        TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Clear(value);
        return arc;
      }
      amount = FSerializer::ArraySize(arc);
      TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Resize(value,amount);
    }
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < value->Count; uVar2 = uVar2 + 1) {
      Serialize<AActor>(arc,(char *)0x0,(TObjPtr<AActor> *)((long)&value->Array->field_0 + lVar3),
                        (TObjPtr<AActor> *)0x0);
      lVar3 = lVar3 + 8;
    }
    FSerializer::EndArray(arc);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, TArray<T, TT> &value, TArray<T, TT> *)
{
	if (arc.isWriting())
	{
		if (value.Size() == 0) return arc;	// do not save empty arrays
	}
	bool res = arc.BeginArray(key);
	if (arc.isReading())
	{
		if (!res)
		{
			value.Clear();
			return arc;
		}
		value.Resize(arc.ArraySize());
	}
	for (unsigned i = 0; i < value.Size(); i++)
	{
		Serialize(arc, nullptr, value[i], (T*)nullptr);
	}
	arc.EndArray();
	return arc;
}